

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::ExtPrivkey::GetExtPubkey(ExtPubkey *__return_storage_ptr__,ExtPrivkey *this)

{
  uchar *puVar1;
  size_type sVar2;
  CfdException *pCVar3;
  ByteData local_1c8;
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8;
  CfdSourceLocation local_188;
  allocator<unsigned_char> local_169;
  undefined1 local_168 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_148;
  CfdSourceLocation local_128;
  int local_fc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data;
  ext_key extkey;
  ExtPrivkey *this_local;
  
  extkey.pub_key_tweak_sum._24_8_ = this;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,
                     &this->serialize_data_);
  local_e0 = local_f8;
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_f8);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e0);
  local_fc = bip32_key_unserialize(puVar1,sVar2,&serialize_data);
  if (local_fc != 0) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x2b5;
    local_128.funcname = "GetExtPubkey";
    logger::warn<int&>(&local_128,"bip32_key_unserialize error. ret={}",&local_fc);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_148,"ExtPrivkey unserialize error.",
               (allocator *)
               ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_148);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  extkey.pad1[2] = '\x01';
  ::std::allocator<unsigned_char>::allocator(&local_169);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,0x4e,&local_169);
  ::std::allocator<unsigned_char>::~allocator(&local_169);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  local_fc = bip32_key_serialize(&serialize_data,1,puVar1,sVar2);
  if (local_fc != 0) {
    local_188.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_188.filename = local_188.filename + 1;
    local_188.line = 0x2c3;
    local_188.funcname = "GetExtPubkey";
    logger::warn<int&>(&local_188,"GetExtPubkey bip32_key_serialize error. ret={}",&local_fc);
    local_1aa = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_1a8,"ExtPrivkey Pubkey serialize error.",&local_1a9);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_1a8);
    local_1aa = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_1c8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  ExtPubkey::ExtPubkey(__return_storage_ptr__,&local_1c8,&this->tweak_sum_);
  ByteData::~ByteData(&local_1c8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_f8);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPrivkey::GetExtPubkey() const {
  struct ext_key extkey;

  const std::vector<uint8_t>& serialize_data = serialize_data_.GetBytes();
  int ret = bip32_key_unserialize(
      serialize_data.data(), serialize_data.size(), &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_unserialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey unserialize error.");
  }

  // copy data
  extkey.priv_key[0] = BIP32_FLAG_KEY_PUBLIC;
  // その他設定の上書きはlibwallyに任せる

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PUBLIC, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "GetExtPubkey bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "ExtPrivkey Pubkey serialize error.");
  }

  return ExtPubkey(ByteData(data), tweak_sum_);
}